

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

bool compactor_switch_compaction_flag(filemgr *file,bool flag)

{
  avl_node *paVar1;
  byte in_SIL;
  undefined8 *in_RDI;
  openfiles_elem_conflict *elem;
  openfiles_elem_conflict query;
  avl_node *a;
  char local_560 [8];
  avl_cmp_func *in_stack_fffffffffffffaa8;
  avl_node *in_stack_fffffffffffffab0;
  avl_tree *in_stack_fffffffffffffab8;
  bool local_1;
  
  strcpy(local_560,(char *)*in_RDI);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  paVar1 = avl_search(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8)
  ;
  if (paVar1 == (avl_node *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
    local_1 = false;
  }
  else if ((*(byte *)((long)&paVar1[-1].left + 4) & 1) == (in_SIL & 1)) {
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
    local_1 = false;
  }
  else {
    *(byte *)((long)&paVar1[-1].left + 4) = in_SIL & 1;
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool compactor_switch_compaction_flag(struct filemgr *file, bool flag)
{
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    strcpy(query.filename, file->filename);
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a) {
        // found
        elem = _get_entry(a, struct openfiles_elem, avl);
        if (elem->compaction_flag == flag) {
            // already switched by other thread .. return false
            mutex_unlock(&cpt_lock);
            return false;
        }
        // switch
        elem->compaction_flag = flag;
        mutex_unlock(&cpt_lock);
        return true;
    }
    // file doesn't exist .. already compacted or deregistered
    mutex_unlock(&cpt_lock);
    return false;
}